

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FillSpecsOf.hpp
# Opt level: O1

string * __thiscall
sciplot::FillSpecsOf<sciplot::DrawSpecs>::repr_abi_cxx11_
          (string *__return_storage_ptr__,FillSpecsOf<sciplot::DrawSpecs> *this)

{
  string *psVar1;
  pointer pcVar2;
  int iVar3;
  undefined8 *puVar4;
  long *plVar5;
  ostream *poVar6;
  ulong *puVar7;
  size_type *psVar8;
  string borderstyle;
  string fillstyle;
  stringstream ss;
  ulong *local_2b8;
  char *local_2b0;
  ulong local_2a8;
  long lStack_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  char *local_278;
  char *local_270;
  char local_268;
  undefined7 uStack_267;
  string local_258;
  string local_238;
  string local_218;
  string local_1f8;
  string local_1d8;
  undefined1 local_1b8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8 [7];
  ios_base local_138 [264];
  
  local_278 = &local_268;
  local_270 = (char *)0x0;
  local_268 = '\0';
  psVar1 = &this->m_fillmode;
  iVar3 = std::__cxx11::string::compare((char *)psVar1);
  if (iVar3 == 0) {
    std::operator+(&local_298,"fillstyle ",&this->m_transparent);
    plVar5 = (long *)std::__cxx11::string::append((char *)&local_298);
    local_2b8 = &local_2a8;
    puVar7 = (ulong *)(plVar5 + 2);
    if ((ulong *)*plVar5 == puVar7) {
      local_2a8 = *puVar7;
      lStack_2a0 = plVar5[3];
    }
    else {
      local_2a8 = *puVar7;
      local_2b8 = (ulong *)*plVar5;
    }
    local_2b0 = (char *)plVar5[1];
    *plVar5 = (long)puVar7;
    plVar5[1] = 0;
    *(undefined1 *)(plVar5 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2b8,(ulong)(this->m_density)._M_dataplus._M_p);
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)psVar1);
    if (iVar3 != 0) {
      iVar3 = std::__cxx11::string::compare((char *)psVar1);
      if (iVar3 == 0) {
        std::__cxx11::string::_M_replace((ulong)&local_278,0,local_270,0x18d8b1);
      }
      goto LAB_0013f79a;
    }
    std::operator+(&local_298,"fillstyle ",&this->m_transparent);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_298);
    local_2b8 = &local_2a8;
    puVar7 = puVar4 + 2;
    if ((ulong *)*puVar4 == puVar7) {
      local_2a8 = *puVar7;
      lStack_2a0 = puVar4[3];
    }
    else {
      local_2a8 = *puVar7;
      local_2b8 = (ulong *)*puVar4;
    }
    local_2b0 = (char *)puVar4[1];
    *puVar4 = puVar7;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
    plVar5 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_2b8,(ulong)(this->m_pattern_number)._M_dataplus._M_p)
    ;
  }
  psVar8 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar8) {
    local_1a8[0]._0_8_ = *psVar8;
    local_1a8[0]._8_8_ = plVar5[3];
    local_1b8._0_8_ = local_1b8 + 0x10;
  }
  else {
    local_1a8[0]._0_8_ = *psVar8;
    local_1b8._0_8_ = (size_type *)*plVar5;
  }
  local_1b8._8_8_ = plVar5[1];
  *plVar5 = (long)psVar8;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  std::__cxx11::string::operator=((string *)&local_278,(string *)local_1b8);
  if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
    operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
  }
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
LAB_0013f79a:
  local_2b0 = (char *)0x0;
  local_2a8 = local_2a8 & 0xffffffffffffff00;
  local_2b8 = &local_2a8;
  iVar3 = std::__cxx11::string::compare((char *)&this->m_bordershow);
  if (iVar3 != 0) {
    iVar3 = std::__cxx11::string::compare((char *)&this->m_bordershow);
    if (iVar3 == 0) {
      std::__cxx11::string::_M_replace((ulong)&local_2b8,0,local_2b0,0x18d03a);
      local_1f8._M_dataplus._M_p = (pointer)&local_1f8.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,"linecolor","");
      pcVar2 = (this->m_bordercolor)._M_dataplus._M_p;
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_218,pcVar2,pcVar2 + (this->m_bordercolor)._M_string_length);
      gnuplot::optionValueStr((string *)local_1b8,&local_1f8,&local_218);
      std::__cxx11::string::_M_append((char *)&local_2b8,local_1b8._0_8_);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p,local_1f8.field_2._M_allocated_capacity + 1);
      }
      local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_258,"linewidth","");
      pcVar2 = (this->m_borderlinewidth)._M_dataplus._M_p;
      local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_238,pcVar2,pcVar2 + (this->m_borderlinewidth)._M_string_length);
      gnuplot::optionValueStr((string *)local_1b8,&local_258,&local_238);
      std::__cxx11::string::_M_append((char *)&local_2b8,local_1b8._0_8_);
      if ((undefined1 *)local_1b8._0_8_ != local_1b8 + 0x10) {
        operator_delete((void *)local_1b8._0_8_,local_1a8[0]._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_238._M_dataplus._M_p != &local_238.field_2) {
        operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_258._M_dataplus._M_p != &local_258.field_2) {
        operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      std::__cxx11::string::_M_replace((ulong)&local_2b8,0,local_2b0,0x18d085);
    }
  }
  std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)(local_1b8 + 0x10),(this->m_fillcolor)._M_dataplus._M_p,
                      (this->m_fillcolor)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  poVar6 = std::__ostream_insert<char,std::char_traits<char>>(poVar6,local_278,(long)local_270);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6," ",1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar6,(char *)local_2b8,(long)local_2b0);
  std::__cxx11::stringbuf::str();
  internal::removeExtraWhitespaces(__return_storage_ptr__,&local_1d8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
  std::ios_base::~ios_base(local_138);
  if (local_2b8 != &local_2a8) {
    operator_delete(local_2b8,local_2a8 + 1);
  }
  if (local_278 != &local_268) {
    operator_delete(local_278,CONCAT71(uStack_267,local_268) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

auto FillSpecsOf<DerivedSpecs>::repr() const -> std::string
{
    std::string fillstyle; // ensure it remains empty if no fill style option has been given!
    if(m_fillmode == "solid")
        fillstyle = "fillstyle " + m_transparent + " solid " + m_density;
    else if(m_fillmode == "pattern")
        fillstyle = "fillstyle " + m_transparent + " pattern " + m_pattern_number;
    else if(m_fillmode == "empty")
        fillstyle = "fillstyle empty";

    std::string borderstyle; // ensure it remains empty if no border option has been given!
    if(m_bordershow != "")
    {
        if(m_bordershow == "yes")
        {
            borderstyle  = "border ";
            borderstyle += gnuplot::optionValueStr("linecolor", m_bordercolor);
            borderstyle += gnuplot::optionValueStr("linewidth", m_borderlinewidth);
        }
        else borderstyle = "noborder";
    }

    std::stringstream ss;
    ss << m_fillcolor << " " << fillstyle << " " << borderstyle;

    return internal::removeExtraWhitespaces(ss.str());
}